

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umemstream.h
# Opt level: O0

void __thiscall umemstream::umemstream(umemstream *this,char *p,size_t l)

{
  size_t l_local;
  char *p_local;
  umemstream *this_local;
  
  std::ios::ios((ios *)&(this->super_istream).field_0x50);
  (this->super_istream)._vptr_basic_istream = (_func_int **)&PTR__umemstream_002286d8;
  *(undefined ***)&(this->super_istream).field_0x50 = &PTR__umemstream_00228700;
  std::istream::istream(this,(streambuf *)&PTR_construction_vtable_24__00228718);
  (this->super_istream)._vptr_basic_istream = (_func_int **)&PTR__umemstream_002286d8;
  *(undefined ***)&(this->super_istream).field_0x50 = &PTR__umemstream_00228700;
  umembuf::umembuf((umembuf *)&(this->super_istream).field_0x10,p,l);
  std::ios::rdbuf((streambuf *)
                  ((long)&(this->super_istream)._vptr_basic_istream +
                  (long)(this->super_istream)._vptr_basic_istream[-3]));
  return;
}

Assistant:

umemstream(const char *p, size_t l) : std::istream(&buffer_),
    buffer_(p, l) {
    rdbuf(&buffer_);
  }